

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiStyle::ImGuiStyle(ImGuiStyle *this)

{
  ImVec4 *local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  ImVec2 local_20;
  ImVec2 local_18;
  ImGuiStyle *local_10;
  ImGuiStyle *this_local;
  
  local_10 = this;
  ImVec2::ImVec2(&this->WindowPadding);
  ImVec2::ImVec2(&this->WindowMinSize);
  ImVec2::ImVec2(&this->WindowTitleAlign);
  ImVec2::ImVec2(&this->FramePadding);
  ImVec2::ImVec2(&this->ItemSpacing);
  ImVec2::ImVec2(&this->ItemInnerSpacing);
  ImVec2::ImVec2(&this->TouchExtraPadding);
  ImVec2::ImVec2(&this->ButtonTextAlign);
  ImVec2::ImVec2(&this->DisplayWindowPadding);
  ImVec2::ImVec2(&this->DisplaySafeAreaPadding);
  local_68 = this->Colors;
  do {
    ImVec4::ImVec4(local_68);
    local_68 = local_68 + 1;
  } while ((ImGuiStyle *)local_68 != this + 1);
  this->Alpha = 1.0;
  ImVec2::ImVec2(&local_18,8.0,8.0);
  this->WindowPadding = local_18;
  this->WindowRounding = 7.0;
  this->WindowBorderSize = 1.0;
  ImVec2::ImVec2(&local_20,32.0,32.0);
  this->WindowMinSize = local_20;
  ImVec2::ImVec2(&local_28,0.0,0.5);
  this->WindowTitleAlign = local_28;
  this->ChildRounding = 0.0;
  this->ChildBorderSize = 1.0;
  this->PopupRounding = 0.0;
  this->PopupBorderSize = 1.0;
  ImVec2::ImVec2(&local_30,4.0,3.0);
  this->FramePadding = local_30;
  this->FrameRounding = 0.0;
  this->FrameBorderSize = 0.0;
  ImVec2::ImVec2(&local_38,8.0,4.0);
  this->ItemSpacing = local_38;
  ImVec2::ImVec2(&local_40,4.0,4.0);
  this->ItemInnerSpacing = local_40;
  ImVec2::ImVec2(&local_48,0.0,0.0);
  this->TouchExtraPadding = local_48;
  this->IndentSpacing = 21.0;
  this->ColumnsMinSpacing = 6.0;
  this->ScrollbarSize = 16.0;
  this->ScrollbarRounding = 9.0;
  this->GrabMinSize = 10.0;
  this->GrabRounding = 0.0;
  ImVec2::ImVec2(&local_50,0.5,0.5);
  this->ButtonTextAlign = local_50;
  ImVec2::ImVec2(&local_58,20.0,20.0);
  this->DisplayWindowPadding = local_58;
  ImVec2::ImVec2(&local_60,3.0,3.0);
  this->DisplaySafeAreaPadding = local_60;
  this->MouseCursorScale = 1.0;
  this->AntiAliasedLines = true;
  this->AntiAliasedFill = true;
  this->CurveTessellationTol = 1.25;
  ImGui::StyleColorsDark(this);
  return;
}

Assistant:

ImGuiStyle::ImGuiStyle()
{
    Alpha                   = 1.0f;             // Global alpha applies to everything in ImGui
    WindowPadding           = ImVec2(8,8);      // Padding within a window
    WindowRounding          = 7.0f;             // Radius of window corners rounding. Set to 0.0f to have rectangular windows
    WindowBorderSize        = 1.0f;             // Thickness of border around windows. Generally set to 0.0f or 1.0f. Other values not well tested.
    WindowMinSize           = ImVec2(32,32);    // Minimum window size
    WindowTitleAlign        = ImVec2(0.0f,0.5f);// Alignment for title bar text
    ChildRounding           = 0.0f;             // Radius of child window corners rounding. Set to 0.0f to have rectangular child windows
    ChildBorderSize         = 1.0f;             // Thickness of border around child windows. Generally set to 0.0f or 1.0f. Other values not well tested.
    PopupRounding           = 0.0f;             // Radius of popup window corners rounding. Set to 0.0f to have rectangular child windows
    PopupBorderSize         = 1.0f;             // Thickness of border around popup or tooltip windows. Generally set to 0.0f or 1.0f. Other values not well tested.
    FramePadding            = ImVec2(4,3);      // Padding within a framed rectangle (used by most widgets)
    FrameRounding           = 0.0f;             // Radius of frame corners rounding. Set to 0.0f to have rectangular frames (used by most widgets).
    FrameBorderSize         = 0.0f;             // Thickness of border around frames. Generally set to 0.0f or 1.0f. Other values not well tested.
    ItemSpacing             = ImVec2(8,4);      // Horizontal and vertical spacing between widgets/lines
    ItemInnerSpacing        = ImVec2(4,4);      // Horizontal and vertical spacing between within elements of a composed widget (e.g. a slider and its label)
    TouchExtraPadding       = ImVec2(0,0);      // Expand reactive bounding box for touch-based system where touch position is not accurate enough. Unfortunately we don't sort widgets so priority on overlap will always be given to the first widget. So don't grow this too much!
    IndentSpacing           = 21.0f;            // Horizontal spacing when e.g. entering a tree node. Generally == (FontSize + FramePadding.x*2).
    ColumnsMinSpacing       = 6.0f;             // Minimum horizontal spacing between two columns
    ScrollbarSize           = 16.0f;            // Width of the vertical scrollbar, Height of the horizontal scrollbar
    ScrollbarRounding       = 9.0f;             // Radius of grab corners rounding for scrollbar
    GrabMinSize             = 10.0f;            // Minimum width/height of a grab box for slider/scrollbar
    GrabRounding            = 0.0f;             // Radius of grabs corners rounding. Set to 0.0f to have rectangular slider grabs.
    ButtonTextAlign         = ImVec2(0.5f,0.5f);// Alignment of button text when button is larger than text.
    DisplayWindowPadding    = ImVec2(20,20);    // Window positions are clamped to be visible within the display area by at least this amount. Only covers regular windows.
    DisplaySafeAreaPadding  = ImVec2(3,3);      // If you cannot see the edge of your screen (e.g. on a TV) increase the safe area padding. Covers popups/tooltips as well regular windows.
    MouseCursorScale        = 1.0f;             // Scale software rendered mouse cursor (when io.MouseDrawCursor is enabled). May be removed later.
    AntiAliasedLines        = true;             // Enable anti-aliasing on lines/borders. Disable if you are really short on CPU/GPU.
    AntiAliasedFill         = true;             // Enable anti-aliasing on filled shapes (rounded rectangles, circles, etc.)
    CurveTessellationTol    = 1.25f;            // Tessellation tolerance when using PathBezierCurveTo() without a specific number of segments. Decrease for highly tessellated curves (higher quality, more polygons), increase to reduce quality.

    // Default theme
    ImGui::StyleColorsDark(this);
}